

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketAcceptor.cpp
# Opt level: O3

void __thiscall
FIX::ThreadedSocketAcceptor::onInitialize(ThreadedSocketAcceptor *this,SessionSettings *s)

{
  _Rb_tree_color _Var1;
  _Base_ptr p_Var2;
  bool bVar3;
  bool reuse;
  uint uVar4;
  int optval;
  Dictionary *this_00;
  _Rb_tree<FIX::SessionID,FIX::SessionID,std::_Identity<FIX::SessionID>,std::less<FIX::SessionID>,std::allocator<FIX::SessionID>>
  *this_01;
  undefined7 extraout_var;
  mapped_type_conflict *pmVar5;
  long *plVar6;
  _Base_ptr p_Var7;
  long *plVar8;
  size_type *psVar9;
  int optval_00;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  int port;
  undefined1 auVar12 [12];
  socket_handle socket;
  SocketException e;
  set<int,_std::less<int>,_std::allocator<int>_> ports;
  set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> sessions;
  socket_handle local_1b4;
  string local_1b0;
  undefined4 local_18c;
  undefined1 local_188 [80];
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_138;
  SocketToPort *local_130;
  PortToSessions *local_128;
  SessionSettings *local_120;
  _Rb_tree_node_base *local_118;
  string local_110;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  local_60;
  
  local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b0._M_impl.super__Rb_tree_header._M_header;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_120 = s;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
  SessionSettings::getSessions
            ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
             &local_60,s);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    local_128 = &this->m_portToSessions;
    local_130 = &this->m_socketToPort;
    local_138 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                &this->m_sockets;
    do {
      local_118 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      this_00 = SessionSettings::get
                          (local_120,
                           (SessionID *)
                           (local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1));
      local_188._0_8_ = local_188 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"SocketAcceptPort","");
      uVar4 = Dictionary::getInt(this_00,(string *)local_188);
      if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
        operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
      }
      port = (int)(short)uVar4;
      local_188._0_4_ = port;
      this_01 = (_Rb_tree<FIX::SessionID,FIX::SessionID,std::_Identity<FIX::SessionID>,std::less<FIX::SessionID>,std::allocator<FIX::SessionID>>
                 *)std::
                   map<int,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>_>_>_>
                   ::operator[](local_128,(key_type *)local_188);
      std::
      _Rb_tree<FIX::SessionID,FIX::SessionID,std::_Identity<FIX::SessionID>,std::less<FIX::SessionID>,std::allocator<FIX::SessionID>>
      ::_M_insert_unique<FIX::SessionID_const&>
                (this_01,(SessionID *)(local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1)
                );
      if (local_b0._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_001b5de2:
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_insert_unique<int>(&local_b0,(int *)local_188);
        local_188._0_8_ = local_188 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"SocketReuseAddress","")
        ;
        bVar3 = Dictionary::has(this_00,(string *)local_188);
        reuse = true;
        if (bVar3) {
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1b0,"SocketReuseAddress","");
          reuse = Dictionary::getBool(this_00,&local_1b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
        }
        if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
          operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
        }
        local_188._0_8_ = local_188 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"SocketNodelay","");
        bVar3 = Dictionary::has(this_00,(string *)local_188);
        if (bVar3) {
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"SocketNodelay","");
          bVar3 = Dictionary::getBool(this_00,&local_1b0);
          local_18c = (undefined4)CONCAT71(extraout_var,bVar3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          local_18c = 0;
        }
        if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
          operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
        }
        local_188._0_8_ = local_188 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_188,"SocketSendBufferSize","");
        bVar3 = Dictionary::has(this_00,(string *)local_188);
        optval_00 = 0;
        if (bVar3) {
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1b0,"SocketSendBufferSize","");
          optval_00 = Dictionary::getInt(this_00,&local_1b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
        }
        if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
          operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
        }
        local_188._0_8_ = local_188 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_188,"SocketReceiveBufferSize","");
        bVar3 = Dictionary::has(this_00,(string *)local_188);
        optval = 0;
        if (bVar3) {
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1b0,"SocketReceiveBufferSize","");
          optval = Dictionary::getInt(this_00,&local_1b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
        }
        if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
          operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
        }
        local_1b4 = socket_createAcceptor(port,reuse);
        if (local_1b4 == -1) {
          SocketException::SocketException((SocketException *)local_188);
          socket_close(local_1b4);
          auVar12 = __cxa_allocate_exception(0x50);
          IntConvertor::convert_abi_cxx11_
                    (&local_110,(IntConvertor *)(ulong)(uVar4 & 0xffff),auVar12._8_4_);
          std::operator+(&local_80,"Unable to create, bind, or listen to port ",&local_110);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_80);
          local_f0 = (long *)*plVar6;
          plVar8 = plVar6 + 2;
          if (local_f0 == plVar8) {
            local_e0 = *plVar8;
            lStack_d8 = plVar6[3];
            local_f0 = &local_e0;
          }
          else {
            local_e0 = *plVar8;
          }
          local_e8 = plVar6[1];
          *plVar6 = (long)plVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::logic_error::what();
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_f0);
          local_d0 = (long *)*plVar6;
          plVar8 = plVar6 + 2;
          if (local_d0 == plVar8) {
            local_c0 = *plVar8;
            lStack_b8 = plVar6[3];
            local_d0 = &local_c0;
          }
          else {
            local_c0 = *plVar8;
          }
          local_c8 = plVar6[1];
          *plVar6 = (long)plVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_d0);
          local_1b0._M_dataplus._M_p = (pointer)*plVar6;
          psVar9 = (size_type *)(plVar6 + 2);
          if ((size_type *)local_1b0._M_dataplus._M_p == psVar9) {
            local_1b0.field_2._M_allocated_capacity = *psVar9;
            local_1b0.field_2._8_8_ = plVar6[3];
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          }
          else {
            local_1b0.field_2._M_allocated_capacity = *psVar9;
          }
          local_1b0._M_string_length = plVar6[1];
          *plVar6 = (long)psVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          RuntimeError::RuntimeError(auVar12._0_8_,&local_1b0);
          __cxa_throw(auVar12._0_8_,&RuntimeError::typeinfo,FIX::Exception::~Exception);
        }
        if ((char)local_18c != '\0') {
          socket_setsockopt(local_1b4,1);
        }
        if (optval_00 != 0) {
          socket_setsockopt(local_1b4,7,optval_00);
        }
        if (optval != 0) {
          socket_setsockopt(local_1b4,8,optval);
        }
        pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[](local_130,&local_1b4);
        *pmVar5 = port;
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>(local_138,&local_1b4);
      }
      else {
        p_Var2 = local_b0._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var11 = &local_b0._M_impl.super__Rb_tree_header._M_header;
        do {
          p_Var10 = p_Var11;
          p_Var7 = p_Var2;
          _Var1 = p_Var7[1]._M_color;
          p_Var11 = p_Var7;
          if ((int)_Var1 < port) {
            p_Var11 = p_Var10;
          }
          p_Var2 = (&p_Var7->_M_left)[(int)_Var1 < port];
        } while ((&p_Var7->_M_left)[(int)_Var1 < port] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var11 == &local_b0._M_impl.super__Rb_tree_header)
        goto LAB_001b5de2;
        if ((int)_Var1 < port) {
          p_Var7 = p_Var10;
        }
        if (port < (int)p_Var7[1]._M_color) goto LAB_001b5de2;
      }
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)std::_Rb_tree_increment(local_118);
    } while ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
             &local_60._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::~_Rb_tree(&local_60);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_b0);
  return;
}

Assistant:

void ThreadedSocketAcceptor::onInitialize( const SessionSettings& s )
EXCEPT ( RuntimeError )
{
  short port = 0;
  std::set<int> ports;

  std::set<SessionID> sessions = s.getSessions();
  std::set<SessionID>::iterator i = sessions.begin();
  for( ; i != sessions.end(); ++i )
  {
    const Dictionary& settings = s.get( *i );
    port = (short)settings.getInt( SOCKET_ACCEPT_PORT );

    m_portToSessions[port].insert( *i );

    if( ports.find(port) != ports.end() )
      continue;
    ports.insert( port );

    const bool reuseAddress = settings.has( SOCKET_REUSE_ADDRESS ) ? 
      settings.getBool( SOCKET_REUSE_ADDRESS ) : true;

    const bool noDelay = settings.has( SOCKET_NODELAY ) ? 
      settings.getBool( SOCKET_NODELAY ) : false;

    const int sendBufSize = settings.has( SOCKET_SEND_BUFFER_SIZE ) ?
      settings.getInt( SOCKET_SEND_BUFFER_SIZE ) : 0;

    const int rcvBufSize = settings.has( SOCKET_RECEIVE_BUFFER_SIZE ) ?
      settings.getInt( SOCKET_RECEIVE_BUFFER_SIZE ) : 0;

    socket_handle socket = socket_createAcceptor( port, reuseAddress );
    if( socket == INVALID_SOCKET_HANDLE )
    {
      SocketException e;
      socket_close( socket );
      throw RuntimeError( "Unable to create, bind, or listen to port " 
                         + IntConvertor::convert( (unsigned short)port ) + " (" + e.what() + ")" );
    }
    if( noDelay )
      socket_setsockopt( socket, TCP_NODELAY );
    if( sendBufSize )
      socket_setsockopt( socket, SO_SNDBUF, sendBufSize );
    if( rcvBufSize )
      socket_setsockopt( socket, SO_RCVBUF, rcvBufSize );

    m_socketToPort[socket] = port;
    m_sockets.insert( socket );
  }    
}